

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

JavascriptBigInt *
Js::JavascriptBigInt::CreateZeroWithLength(digit_t length,ScriptContext *scriptContext)

{
  Recycler *pRVar1;
  JavascriptBigInt *this;
  JavascriptLibrary *this_00;
  StaticType *type;
  unsigned_long *ptr;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  JavascriptBigInt *local_20;
  JavascriptBigInt *bigintNew;
  ScriptContext *scriptContext_local;
  digit_t length_local;
  
  bigintNew = (JavascriptBigInt *)scriptContext;
  scriptContext_local = (ScriptContext *)length;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
             ,0x15);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  local_58 = Memory::Recycler::AllocInlined;
  local_50 = 0;
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,pRVar1,0x43c4b0);
  this_00 = ScriptContext::GetLibrary((ScriptContext *)bigintNew);
  type = JavascriptLibrary::GetBigIntTypeStatic(this_00);
  JavascriptBigInt(this,type);
  this->m_length = (Type)scriptContext_local;
  this->m_isNegative = false;
  this->m_maxLength = (Type)scriptContext_local;
  local_20 = this;
  pRVar1 = ScriptContext::GetRecycler((ScriptContext *)bigintNew);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,(type_info *)&unsigned_long::typeinfo,0,local_20->m_length,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
             ,0x19);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_80);
  ptr = Memory::AllocateArray<Memory::Recycler,unsigned_long,false>
                  ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocLeafZero,0,local_20->m_length
                  );
  Memory::WriteBarrierPtr<unsigned_long>::operator=(&local_20->m_digits,ptr);
  return local_20;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::CreateZeroWithLength(digit_t length, ScriptContext * scriptContext)
    {
        JavascriptBigInt * bigintNew = RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, scriptContext->GetLibrary()->GetBigIntTypeStatic());
        bigintNew->m_length = length;
        bigintNew->m_isNegative = false;
        bigintNew->m_maxLength = length;
        bigintNew->m_digits = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), digit_t, bigintNew->m_length);
        return bigintNew;
    }